

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O0

void __thiscall
SwitchIRBuilder::BuildBinaryTraverseInstr
          (SwitchIRBuilder *this,int start,int end,uint32 defaultLeafBranch)

{
  OpCode opcode;
  CaseNode *this_00;
  CaseNode *this_01;
  SwitchAdapter *pSVar1;
  uint32 uVar2;
  uint32 uVar3;
  Type *ppCVar4;
  BranchInstr *pBVar5;
  Opnd *src1Opnd;
  Opnd *src2Opnd;
  int index;
  BranchInstr *branchInstr;
  BranchInstr *caseInstr;
  CaseNode *startNode;
  CaseNode *midNode;
  int mid;
  uint32 defaultLeafBranch_local;
  int end_local;
  int start_local;
  SwitchIRBuilder *this_local;
  
  if (start <= end) {
    if (DAT_01eafdb0 + -1 < end - start) {
      index = start + ((end - start) + 1) / 2;
      ppCVar4 = JsUtil::
                List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->m_caseNodes,index);
      this_00 = *ppCVar4;
      ppCVar4 = JsUtil::
                List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->m_caseNodes,start);
      this_01 = *ppCVar4;
      pBVar5 = CaseNode::GetCaseInstr(this_01);
      opcode = this->m_geOp;
      src1Opnd = IR::Instr::GetSrc1(&pBVar5->super_Instr);
      src2Opnd = CaseNode::GetLowerBound(this_00);
      pBVar5 = IR::BranchInstr::New(opcode,(LabelInstr *)0x0,src1Opnd,src2Opnd,this->m_func);
      pBVar5->field_0x58 = pBVar5->field_0x58 & 0xfd | 2;
      pSVar1 = this->m_adapter;
      uVar2 = CaseNode::GetOffset(this_01);
      uVar3 = CaseNode::GetOffset(this_00);
      (**pSVar1->_vptr_SwitchAdapter)(pSVar1,pBVar5,(ulong)uVar2,(ulong)uVar3,1);
      BuildBinaryTraverseInstr(this,start,index + -1,defaultLeafBranch);
      BuildBinaryTraverseInstr(this,index,end,defaultLeafBranch);
    }
    else {
      BuildLinearTraverseInstr(this,start,end,defaultLeafBranch);
    }
  }
  return;
}

Assistant:

void
SwitchIRBuilder::BuildBinaryTraverseInstr(int start, int end, uint32 defaultLeafBranch)
{
    int mid;

    if (start > end)
    {
        return;
    }

    if (end - start <= CONFIG_FLAG(MaxLinearIntCaseCount) - 1) // -1 for handling zero index as the base
    {
        //if only 3 elements, then do linear search on the elements
        BuildLinearTraverseInstr(start, end, defaultLeafBranch);
        return;
    }

    mid = start + ((end - start + 1) / 2);
    CaseNode* midNode = m_caseNodes->Item(mid);
    CaseNode* startNode = m_caseNodes->Item(start);

    // if the value that we are switching on is greater than the start case value
    // then we branch right to the right half of the binary search
    IR::BranchInstr* caseInstr = startNode->GetCaseInstr();
    IR::BranchInstr* branchInstr = IR::BranchInstr::New(m_geOp, nullptr, caseInstr->GetSrc1(), midNode->GetLowerBound(), m_func);
    branchInstr->m_isSwitchBr = true;
    m_adapter->AddBranchInstr(branchInstr, startNode->GetOffset(), midNode->GetOffset(), true);

    BuildBinaryTraverseInstr(start, mid - 1, defaultLeafBranch);
    BuildBinaryTraverseInstr(mid, end, defaultLeafBranch);
}